

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir-gen.c
# Opt level: O0

void update_bitmap_after_coalescing(gen_ctx_t gen_ctx,bitmap_t bm)

{
  size_t sVar1;
  int iVar2;
  uint uVar3;
  MIR_reg_t MVar4;
  undefined1 local_38 [8];
  bitmap_iterator_t bi;
  size_t nel;
  MIR_reg_t first_reg;
  MIR_reg_t reg;
  bitmap_t bm_local;
  gen_ctx_t gen_ctx_local;
  
  bitmap_iterator_init((bitmap_iterator_t *)local_38,bm);
  while (iVar2 = bitmap_iterator_next((bitmap_iterator_t *)local_38,&bi.nbit), sVar1 = bi.nbit,
        iVar2 != 0) {
    uVar3 = (uint)bi.nbit;
    if ((0x21 < uVar3) &&
       (MVar4 = VARR_MIR_reg_tget(gen_ctx->coalesce_ctx->first_coalesced_reg,bi.nbit & 0xffffffff),
       MVar4 != uVar3)) {
      bitmap_clear_bit_p(bm,sVar1 & 0xffffffff);
      bitmap_set_bit_p(bm,(ulong)MVar4);
    }
  }
  return;
}

Assistant:

static void update_bitmap_after_coalescing (gen_ctx_t gen_ctx, bitmap_t bm) {
  MIR_reg_t reg, first_reg;
  size_t nel;
  bitmap_iterator_t bi;

  FOREACH_BITMAP_BIT (bi, bm, nel) {
    reg = (MIR_reg_t) nel;
    if (reg <= MAX_HARD_REG) continue;
    if ((first_reg = VARR_GET (MIR_reg_t, first_coalesced_reg, reg)) == reg) continue;
    bitmap_clear_bit_p (bm, reg);
    bitmap_set_bit_p (bm, first_reg);
  }
}